

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Camera
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  bool bVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  allocator<char> local_109;
  string local_108;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  if (this->upgrade == true) {
    bVar1 = std::operator==(name,"environment");
    if (bVar1) {
      indent_abi_cxx11_(&local_108,this,0);
      Printf<std::__cxx11::string>
                ("%sCamera \"spherical\" \"string mapping\" \"equirectangular\"\n",&local_108);
      goto LAB_004fb1ad;
    }
  }
  indent_abi_cxx11_(&local_108,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sCamera \"%s\"\n",&local_108,name);
LAB_004fb1ad:
  std::__cxx11::string::~string((string *)&local_108);
  if (this->upgrade == true) {
    bVar1 = std::operator==(name,"realistic");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"simpleweighting",&local_109);
      ParameterDictionary::RemoveBool(&local_e8,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
  }
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<((ostream *)&std::cout,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_e8.params);
  return;
}

Assistant:

void FormattingScene::Camera(const std::string &name, ParsedParameterVector params,
                             FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    if (upgrade && name == "environment")
        Printf("%sCamera \"spherical\" \"string mapping\" \"equirectangular\"\n",
               indent());
    else
        Printf("%sCamera \"%s\"\n", indent(), name);
    if (upgrade && name == "realistic")
        dict.RemoveBool("simpleweighting");

    std::cout << dict.ToParameterList(catIndentCount);
}